

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O0

void __thiscall t_cl_generator::generate_enum(t_cl_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  void *this_00;
  string local_e8;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_c8;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_c0;
  t_enum_value **local_b8;
  string local_b0;
  int local_8c;
  iterator iStack_88;
  int value;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_58;
  string local_38;
  t_enum *local_18;
  t_enum *tenum_local;
  t_cl_generator *this_local;
  
  local_18 = tenum;
  tenum_local = (t_enum *)this;
  poVar3 = std::operator<<((ostream *)&this->f_types_,"(thrift:def-enum ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_58,(string *)CONCAT44(extraout_var,iVar2));
  prefix(&local_38,this,&local_58);
  poVar3 = std::operator<<(poVar3,(string *)&local_38);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  __x = t_enum::get_constants(local_18);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&stack0xffffffffffffff78);
  local_8c = -1;
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_types_,(string *)&local_b0);
  std::operator<<(poVar3,"(");
  std::__cxx11::string::~string((string *)&local_b0);
  local_b8 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  iStack_88 = (iterator)local_b8;
  while( true ) {
    local_c0._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff78,&local_c0);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&stack0xffffffffffffff78);
    local_8c = t_enum_value::get_value(*pptVar4);
    local_c8._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff78,&local_c8);
    if (bVar1) {
      poVar3 = (ostream *)
               std::ostream::operator<<(&this->f_types_,std::endl<char,std::char_traits<char>>);
      t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_e8);
      std::operator<<(poVar3," ");
      std::__cxx11::string::~string((string *)&local_e8);
    }
    poVar3 = std::operator<<((ostream *)&this->f_types_,"(\"");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&stack0xffffffffffffff78);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    poVar3 = std::operator<<(poVar3,"\" . ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8c);
    std::operator<<(poVar3,")");
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&stack0xffffffffffffff78);
  }
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_types_,"))");
  this_00 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  return;
}

Assistant:

void t_cl_generator::generate_enum(t_enum* tenum) {
  f_types_ << "(thrift:def-enum " << prefix(tenum->get_name()) << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  int value = -1;

  indent_up();
  f_types_ << indent() << "(";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    value = (*c_iter)->get_value();

    if(c_iter != constants.begin()) f_types_ << endl << indent() << " ";

    f_types_ << "(\"" << (*c_iter)->get_name() << "\" . " << value << ")";
  }
  indent_down();
  f_types_ << "))" << endl << endl;
}